

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_tls12_prf_set_key
          (psa_tls12_prf_key_derivation_t *prf,psa_algorithm_t hash_alg,uint8_t *data,
          size_t data_length)

{
  psa_status_t pVar1;
  
  pVar1 = -0x89;
  if ((prf->state == TLS12_PRF_STATE_SEED_SET) &&
     (pVar1 = psa_hmac_setup_internal(&prf->hmac,data,data_length,hash_alg), pVar1 == 0)) {
    prf->state = TLS12_PRF_STATE_KEY_SET;
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_tls12_prf_set_key( psa_tls12_prf_key_derivation_t *prf,
                                           psa_algorithm_t hash_alg,
                                           const uint8_t *data,
                                           size_t data_length )
{
    psa_status_t status;
    if( prf->state != TLS12_PRF_STATE_SEED_SET )
        return( PSA_ERROR_BAD_STATE );

    status = psa_hmac_setup_internal( &prf->hmac, data, data_length, hash_alg );
    if( status != PSA_SUCCESS )
        return( status );

    prf->state = TLS12_PRF_STATE_KEY_SET;

    return( PSA_SUCCESS );
}